

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_t2enc.c
# Opt level: O2

void jpc_restore_t2state(jpc_enc_t *enc)

{
  jpc_enc_tcmpt_t *pjVar1;
  jpc_enc_cblk_t *pjVar2;
  jpc_enc_tcmpt_t *pjVar3;
  long lVar4;
  uint uVar5;
  jpc_enc_band_t *pjVar6;
  jpc_enc_rlvl_t *pjVar7;
  jpc_enc_band_t *pjVar8;
  jpc_enc_prc_t *pjVar9;
  jpc_enc_rlvl_t *pjVar10;
  
  pjVar3 = enc->curtile->tcmpts;
  pjVar1 = pjVar3 + enc->curtile->numtcmpts;
  for (; pjVar3 != pjVar1; pjVar3 = pjVar3 + 1) {
    pjVar10 = pjVar3->rlvls;
    pjVar7 = pjVar10 + pjVar3->numrlvls;
    for (; pjVar10 != pjVar7; pjVar10 = pjVar10 + 1) {
      pjVar8 = pjVar10->bands;
      if (pjVar8 != (jpc_enc_band_t *)0x0) {
        pjVar6 = pjVar8 + pjVar10->numbands;
        for (; pjVar8 != pjVar6; pjVar8 = pjVar8 + 1) {
          if (pjVar8->data != (jas_matrix_t *)0x0) {
            pjVar9 = pjVar8->prcs;
            for (uVar5 = 0; uVar5 < pjVar10->numprcs; uVar5 = uVar5 + 1) {
              if (pjVar9->cblks != (jpc_enc_cblk_t *)0x0) {
                jpc_tagtree_copy(pjVar9->incltree,pjVar9->savincltree);
                jpc_tagtree_copy(pjVar9->nlibtree,pjVar9->savnlibtree);
                pjVar2 = pjVar9->cblks;
                for (lVar4 = (ulong)pjVar9->numcblks * 0x68; lVar4 != 0; lVar4 = lVar4 + -0x68) {
                  pjVar2->curpass = pjVar2->savedcurpass;
                  pjVar2->numencpasses = pjVar2->savednumencpasses;
                  pjVar2->numlenbits = pjVar2->savednumlenbits;
                  pjVar2 = pjVar2 + 1;
                }
              }
              pjVar9 = pjVar9 + 1;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void jpc_restore_t2state(jpc_enc_t *enc)
{

	jpc_enc_tcmpt_t *comp;
	jpc_enc_tcmpt_t *endcomps;
	jpc_enc_rlvl_t *lvl;
	jpc_enc_rlvl_t *endlvls;
	jpc_enc_band_t *band;
	jpc_enc_band_t *endbands;
	jpc_enc_cblk_t *cblk;
	jpc_enc_cblk_t *endcblks;
	jpc_enc_tile_t *tile;
	unsigned prcno;
	jpc_enc_prc_t *prc;

	tile = enc->curtile;

	endcomps = &tile->tcmpts[tile->numtcmpts];
	for (comp = tile->tcmpts; comp != endcomps; ++comp) {
		endlvls = &comp->rlvls[comp->numrlvls];
		for (lvl = comp->rlvls; lvl != endlvls; ++lvl) {
			if (!lvl->bands) {
				continue;
			}
			endbands = &lvl->bands[lvl->numbands];
			for (band = lvl->bands; band != endbands; ++band) {
				if (!band->data) {
					continue;
				}
				for (prcno = 0, prc = band->prcs; prcno < lvl->numprcs; ++prcno, ++prc) {
					if (!prc->cblks) {
						continue;
					}
					jpc_tagtree_copy(prc->incltree, prc->savincltree);
					jpc_tagtree_copy(prc->nlibtree, prc->savnlibtree);
					endcblks = &prc->cblks[prc->numcblks];
					for (cblk = prc->cblks; cblk != endcblks; ++cblk) {
						cblk->curpass = cblk->savedcurpass;
						cblk->numencpasses = cblk->savednumencpasses;
						cblk->numlenbits = cblk->savednumlenbits;
					}
				}
			}
		}
	}
}